

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

int __thiscall google::protobuf::FileOptions::ByteSize(FileOptions *this)

{
  bool bVar1;
  FileOptions_OptimizeMode value;
  int iVar2;
  string *psVar3;
  UninterpretedOption *value_00;
  UnknownFieldSet *pUVar4;
  int local_18;
  int local_14;
  int i;
  int total_size;
  FileOptions *this_local;
  
  local_14 = 0;
  if ((this->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_java_package(this);
    if (bVar1) {
      psVar3 = java_package_abi_cxx11_(this);
      local_14 = internal::WireFormatLite::StringSize(psVar3);
      local_14 = local_14 + 1;
    }
    bVar1 = has_java_outer_classname(this);
    if (bVar1) {
      psVar3 = java_outer_classname_abi_cxx11_(this);
      iVar2 = internal::WireFormatLite::StringSize(psVar3);
      local_14 = iVar2 + 1 + local_14;
    }
    bVar1 = has_java_multiple_files(this);
    if (bVar1) {
      local_14 = local_14 + 2;
    }
    bVar1 = has_java_generate_equals_and_hash(this);
    if (bVar1) {
      local_14 = local_14 + 3;
    }
    bVar1 = has_optimize_for(this);
    if (bVar1) {
      value = optimize_for(this);
      iVar2 = internal::WireFormatLite::EnumSize(value);
      local_14 = iVar2 + 1 + local_14;
    }
    bVar1 = has_go_package(this);
    if (bVar1) {
      psVar3 = go_package_abi_cxx11_(this);
      iVar2 = internal::WireFormatLite::StringSize(psVar3);
      local_14 = iVar2 + 1 + local_14;
    }
    bVar1 = has_cc_generic_services(this);
    if (bVar1) {
      local_14 = local_14 + 3;
    }
    bVar1 = has_java_generic_services(this);
    if (bVar1) {
      local_14 = local_14 + 3;
    }
  }
  if (((this->_has_bits_[0] & 0xff00) != 0) && (bVar1 = has_py_generic_services(this), bVar1)) {
    local_14 = local_14 + 3;
  }
  iVar2 = uninterpreted_option_size(this);
  local_14 = iVar2 * 2 + local_14;
  for (local_18 = 0; iVar2 = uninterpreted_option_size(this), local_18 < iVar2;
      local_18 = local_18 + 1) {
    value_00 = uninterpreted_option(this,local_18);
    iVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::UninterpretedOption>
                      (value_00);
    local_14 = iVar2 + local_14;
  }
  iVar2 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  local_14 = iVar2 + local_14;
  pUVar4 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar4);
  if (!bVar1) {
    pUVar4 = unknown_fields(this);
    iVar2 = internal::WireFormat::ComputeUnknownFieldsSize(pUVar4);
    local_14 = iVar2 + local_14;
  }
  this->_cached_size_ = local_14;
  return local_14;
}

Assistant:

int FileOptions::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string java_package = 1;
    if (has_java_package()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->java_package());
    }

    // optional string java_outer_classname = 8;
    if (has_java_outer_classname()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->java_outer_classname());
    }

    // optional bool java_multiple_files = 10 [default = false];
    if (has_java_multiple_files()) {
      total_size += 1 + 1;
    }

    // optional bool java_generate_equals_and_hash = 20 [default = false];
    if (has_java_generate_equals_and_hash()) {
      total_size += 2 + 1;
    }

    // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
    if (has_optimize_for()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->optimize_for());
    }

    // optional string go_package = 11;
    if (has_go_package()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->go_package());
    }

    // optional bool cc_generic_services = 16 [default = false];
    if (has_cc_generic_services()) {
      total_size += 2 + 1;
    }

    // optional bool java_generic_services = 17 [default = false];
    if (has_java_generic_services()) {
      total_size += 2 + 1;
    }

  }
  if (_has_bits_[8 / 32] & (0xffu << (8 % 32))) {
    // optional bool py_generic_services = 18 [default = false];
    if (has_py_generic_services()) {
      total_size += 2 + 1;
    }

  }
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2 * this->uninterpreted_option_size();
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->uninterpreted_option(i));
  }

  total_size += _extensions_.ByteSize();

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}